

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O1

Attributes Js::FunctionInfo::GetAttributes(RecyclableObject *function)

{
  Attributes AVar1;
  JavascriptFunction *pJVar2;
  
  AVar1 = None;
  if (((function->type).ptr)->typeId == TypeIds_Function) {
    pJVar2 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    AVar1 = ((pJVar2->functionInfo).ptr)->attributes;
  }
  return AVar1;
}

Assistant:

inline Type * GetType() const { return type; }